

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_begin_object(basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
                  semantic_tag param_2,ser_context *param_3,error_code *ec)

{
  int iVar1;
  int iVar2;
  cbor_container_type *in_RCX;
  binary_stream_sink *in_RDX;
  long in_RDI;
  
  iVar2 = *(int *)(in_RDI + 0xe8) + 1;
  *(int *)(in_RDI + 0xe8) = iVar2;
  iVar1 = cbor_options_common::max_nesting_depth
                    ((cbor_options_common *)
                     (in_RDI + 0x40 + *(long *)(*(long *)(in_RDI + 0x40) + -0x18)));
  if (iVar1 < iVar2) {
    std::error_code::operator=((error_code *)in_RDX,(cbor_errc)((ulong)in_RCX >> 0x20));
  }
  else {
    std::
    vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
    ::emplace_back<jsoncons::cbor::cbor_container_type>
              ((vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                *)in_RDX,in_RCX);
    binary_stream_sink::push_back(in_RDX,(uint8_t)((ulong)in_RCX >> 0x38));
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_object(semantic_tag, const ser_context&, std::error_code& ec) override
    {
        if (JSONCONS_UNLIKELY(++nesting_depth_ > options_.max_nesting_depth()))
        {
            ec = cbor_errc::max_nesting_depth_exceeded;
            JSONCONS_VISITOR_RETURN;
        } 
        stack_.emplace_back(cbor_container_type::indefinite_length_object);
        
        sink_.push_back(0xbf);
        JSONCONS_VISITOR_RETURN;
    }